

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::CollectUnmarkedBlock(Range *curr)

{
  ulong uVar1;
  FastVector<NULLC::Range,_false,_false> *this;
  
  uVar1 = *(ulong *)((long)curr->start + 4);
  if ((uVar1 & 1) == 0) {
    this = (FastVector<NULLC::Range,_false,_false> *)&blocksToFree;
    if (((uint)uVar1 & 0xc) == 4) {
      this = (FastVector<NULLC::Range,_false,_false> *)&blocksToFinalize;
    }
    FastVector<NULLC::Range,_false,_false>::push_back(this,curr);
    return;
  }
  return;
}

Assistant:

void NULLC::CollectUnmarkedBlock(Range& curr)
{
	void *block = curr.start;

	markerType &marker = *(markerType*)((char*)block + 4);

	if(!(marker & NULLC::OBJECT_VISIBLE))
	{
		if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
		{
			blocksToFinalize.push_back(curr);
		}
		else
		{
			blocksToFree.push_back(curr);
		}
	}
}